

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

MidiEvent * __thiscall
smf::MidiFile::addMetaEvent(MidiFile *this,int aTrack,int aTick,int aType,string *metaData)

{
  ulong uVar1;
  MidiEvent *pMVar2;
  int iVar3;
  ulong uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  uVar4 = metaData->_M_string_length;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (int)uVar4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,(long)iVar3);
  uVar1 = 0;
  uVar4 = uVar4 & 0xffffffff;
  if (iVar3 < 1) {
    uVar4 = uVar1;
  }
  for (; uVar4 != uVar1; uVar1 = uVar1 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start[uVar1] = (metaData->_M_dataplus)._M_p[uVar1];
  }
  pMVar2 = addMetaEvent(this,aTrack,aTick,aType,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return pMVar2;
}

Assistant:

MidiEvent* MidiFile::addMetaEvent(int aTrack, int aTick, int aType,
		const std::string& metaData) {
	int length = (int)metaData.size();
	std::vector<uchar> buffer;
	buffer.resize(length);
	int i;
	for (i=0; i<length; i++) {
		buffer[i] = (uchar)metaData[i];
	}
	return addMetaEvent(aTrack, aTick, aType, buffer);
}